

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_matrix.cpp
# Opt level: O3

int __thiscall
ON_Matrix::RowReduce
          (ON_Matrix *this,double zero_tolerance,int pt_dim,int pt_stride,double *pt,double *pivot)

{
  ulong uVar1;
  double **ppdVar2;
  double *pdVar3;
  void *__dest;
  double ***pppdVar4;
  size_t __n;
  long lVar5;
  double *pdVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double local_b8;
  double *local_68;
  double *local_60;
  
  __dest = onmalloc((long)pt_dim * 8);
  uVar9 = this->m_row_count;
  pppdVar4 = &(this->m_rowmem).m_a;
  if (uVar9 != (this->m_rowmem).m_count) {
    pppdVar4 = &this->m;
  }
  uVar12 = this->m_col_count;
  if ((int)uVar9 < this->m_col_count) {
    uVar12 = uVar9;
  }
  if ((int)uVar12 < 1) {
    dVar15 = 0.0;
    iVar10 = 0;
  }
  else {
    ppdVar2 = *pppdVar4;
    __n = ((long)pt_dim << 0x23) >> 0x20;
    lVar5 = (long)pt_stride;
    local_60 = pt + lVar5;
    local_b8 = 0.0;
    uVar13 = 1;
    uVar11 = 0;
    local_68 = pt;
    do {
      onmalloc(0);
      pdVar6 = ppdVar2[uVar11];
      dVar14 = pdVar6[uVar11];
      dVar16 = ABS(dVar14);
      uVar1 = uVar11 + 1;
      uVar9 = (uint)uVar11;
      if ((long)uVar1 < (long)this->m_row_count) {
        uVar7 = uVar11 & 0xffffffff;
        uVar8 = uVar13;
        do {
          if (dVar16 < ABS(ppdVar2[uVar8][uVar11])) {
            uVar7 = uVar8 & 0xffffffff;
            dVar16 = ABS(ppdVar2[uVar8][uVar11]);
          }
          uVar8 = uVar8 + 1;
        } while ((uint)this->m_row_count != uVar8);
      }
      else {
        uVar7 = uVar11 & 0xffffffff;
      }
      dVar15 = dVar16;
      if ((uVar11 != 0) && (local_b8 <= dVar16)) {
        dVar15 = local_b8;
      }
      if (dVar16 <= zero_tolerance) goto LAB_004f29c2;
      if (uVar11 != uVar7) {
        SwapRows(this,(int)uVar7,uVar9);
        memcpy(__dest,pt + pt_stride * (int)uVar7,__n);
        memcpy(pt + pt_stride * (int)uVar7,pt + uVar11 * lVar5,__n);
        memcpy(pt + uVar11 * lVar5,__dest,__n);
        pdVar6 = ppdVar2[uVar11];
        dVar14 = pdVar6[uVar11];
      }
      dVar14 = 1.0 / dVar14;
      if ((dVar14 != 1.0) || (NAN(dVar14))) {
        pdVar6[uVar11] = 1.0;
        ON_ArrayScale(~uVar9 + this->m_col_count,dVar14,pdVar6 + uVar1,pdVar6 + uVar1);
        if (0 < pt_dim) {
          uVar7 = 0;
          do {
            local_68[uVar7] = local_68[uVar7] * dVar14;
            uVar7 = uVar7 + 1;
          } while ((uint)pt_dim != uVar7);
        }
      }
      if ((long)uVar1 < (long)this->m_row_count) {
        pdVar6 = local_60;
        uVar7 = uVar13;
        do {
          pdVar3 = ppdVar2[uVar7];
          dVar14 = pdVar3[uVar11];
          pdVar3[uVar11] = 0.0;
          if (zero_tolerance < ABS(dVar14)) {
            dVar14 = -dVar14;
            ON_Array_aA_plus_B(this->m_col_count + ~uVar9,dVar14,ppdVar2[uVar11] + uVar1,
                               pdVar3 + uVar1,pdVar3 + uVar1);
            if (0 < pt_dim) {
              uVar8 = 0;
              do {
                pdVar6[uVar8] = pt[uVar11 * lVar5 + uVar8] * dVar14 + pdVar6[uVar8];
                uVar8 = uVar8 + 1;
              } while ((uint)pt_dim != uVar8);
            }
          }
          uVar7 = uVar7 + 1;
          pdVar6 = pdVar6 + lVar5;
        } while ((long)uVar7 < (long)this->m_row_count);
      }
      uVar13 = uVar13 + 1;
      local_68 = local_68 + lVar5;
      local_60 = local_60 + lVar5;
      uVar11 = uVar1;
      local_b8 = dVar15;
    } while (uVar1 != uVar12);
    uVar11 = (ulong)uVar12;
LAB_004f29c2:
    iVar10 = (int)uVar11;
  }
  if (pivot != (double *)0x0) {
    *pivot = dVar15;
  }
  onfree(__dest);
  return iVar10;
}

Assistant:

int
ON_Matrix::RowReduce( 
    double zero_tolerance,
    int pt_dim, int pt_stride, double* pt,
    double* pivot 
    )
{
  const int sizeof_pt = pt_dim*sizeof(pt[0]);
  double* tmp_pt = (double*)onmalloc(pt_dim*sizeof(tmp_pt[0]));
  double *ptA, *ptB;
  double x, piv;
  int i, k, ix, rank, pti;

  double** this_m = ThisM();
  piv = 0.0;
  rank = 0;
  const int n = m_row_count <= m_col_count ? m_row_count : m_col_count;
  for ( k = 0; k < n; k++ ) {
//    onfree( onmalloc( 1)); //  8-06-03 lw for cancel thread responsiveness
    onmalloc( 0); // 9-4-03 lw changed to 0
    ix = k;
    x = fabs(this_m[ix][k]);
    for ( i = k+1; i < m_row_count; i++ ) {
      if ( fabs(this_m[i][k]) > x ) {
        ix = i;
        x = fabs(this_m[ix][k]);
      }
    }
    if ( x < piv || k == 0 ) {
      piv = x;
    }
    if ( x <= zero_tolerance )
      break;
    rank++;

    // swap rows of matrix and B
    if ( ix != k ) {
      SwapRows( ix, k );
      ptA = pt + (ix*pt_stride);
      ptB = pt + (k*pt_stride);
      memcpy( tmp_pt, ptA, sizeof_pt );
      memcpy( ptA, ptB, sizeof_pt );
      memcpy( ptB, tmp_pt, sizeof_pt );
    }

    // scale row k of matrix and B
    x = 1.0/this_m[k][k];
    if ( x != 1.0 ) {
      this_m[k][k] = 1.0;
      ON_ArrayScale( m_col_count - 1 - k, x, &this_m[k][k+1], &this_m[k][k+1] );
      ptA = pt + (k*pt_stride);
      for ( pti = 0; pti < pt_dim; pti++ )
        ptA[pti] *= x;
    }

    // zero column k for rows below this_m[k][k]
    ptB = pt + (k*pt_stride);
    for ( i = k+1; i < m_row_count; i++ ) {
      x = -this_m[i][k];
      this_m[i][k] = 0.0;
      if ( fabs(x) > zero_tolerance ) {
        ON_Array_aA_plus_B( m_col_count - 1 - k, x, &this_m[k][k+1], &this_m[i][k+1], &this_m[i][k+1] );
        ptA = pt + (i*pt_stride);
        for ( pti = 0; pti < pt_dim; pti++ ) {
          ptA[pti] += x*ptB[pti];
        }
      }
    }
  }

  if ( pivot )
    *pivot = piv;

  onfree(tmp_pt);

  return rank;
}